

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void __thiscall MemoryMappedFile::~MemoryMappedFile(MemoryMappedFile *this)

{
  MemoryMappedFile *this_local;
  
  if (this->data != (uchar *)0x0) {
    munmap(this->data,this->size);
    this->data = (uchar *)0x0;
  }
  if (this->posix_descriptor != -1) {
    close(this->posix_descriptor);
  }
  return;
}

Assistant:

~MemoryMappedFile() {
#ifdef TINYEXR_USE_WIN32_MMAP
    if (data) {
      (void)UnmapViewOfFile(data);
      data = NULL;
    }

    if (windows_file_mapping != NULL) {
      (void)CloseHandle(windows_file_mapping);
    }

    if (windows_file != INVALID_HANDLE_VALUE) {
      (void)CloseHandle(windows_file);
    }
#elif defined(TINYEXR_USE_POSIX_MMAP)
    if (data) {
      (void)munmap(data, size);
      data = NULL;
    }

    if (posix_descriptor != -1) {
      (void)close(posix_descriptor);
    }
#else
    if (data) {
      (void)free(data);
    }
    data = NULL;
#endif
  }